

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslsocket.cpp
# Opt level: O0

int __thiscall QSslSocketPrivate::init(QSslSocketPrivate *this,EVP_PKEY_CTX *ctx)

{
  pointer pTVar1;
  
  this->mode = UnencryptedMode;
  this->autoStartHandshake = false;
  this->connectionEncrypted = false;
  this->ignoreAllSslErrors = false;
  (this->super_QTcpSocketPrivate).super_QAbstractSocketPrivate.abortCalled = false;
  (this->super_QTcpSocketPrivate).super_QAbstractSocketPrivate.pendingClose = false;
  this->flushTriggered = false;
  QIODevicePrivate::QRingBufferRef::clear((QRingBufferRef *)this);
  QIODevicePrivate::QRingBufferRef::clear((QRingBufferRef *)this);
  QSslCertificate::clear((QSslCertificate *)this);
  QList<QSslCertificate>::clear((QList<QSslCertificate> *)this);
  pTVar1 = std::
           unique_ptr<QTlsPrivate::TlsCryptograph,_std::default_delete<QTlsPrivate::TlsCryptograph>_>
           ::get((unique_ptr<QTlsPrivate::TlsCryptograph,_std::default_delete<QTlsPrivate::TlsCryptograph>_>
                  *)0x3a0413);
  if (pTVar1 != (pointer)0x0) {
    pTVar1 = std::
             unique_ptr<QTlsPrivate::TlsCryptograph,_std::default_delete<QTlsPrivate::TlsCryptograph>_>
             ::operator->((unique_ptr<QTlsPrivate::TlsCryptograph,_std::default_delete<QTlsPrivate::TlsCryptograph>_>
                           *)0x3a042a);
    pTVar1 = (pointer)(**(code **)(*(long *)pTVar1 + 0x60))
                                (pTVar1,*(undefined8 *)
                                         &(this->super_QTcpSocketPrivate).
                                          super_QAbstractSocketPrivate.field_0x8);
  }
  return (int)pTVar1;
}

Assistant:

void QSslSocketPrivate::init()
{
    // TLSTODO: delete those data members.
    mode = QSslSocket::UnencryptedMode;
    autoStartHandshake = false;
    connectionEncrypted = false;
    ignoreAllSslErrors = false;
    abortCalled = false;
    pendingClose = false;
    flushTriggered = false;
    // We don't want to clear the ignoreErrorsList, so
    // that it is possible setting it before connecting.

    buffer.clear();
    writeBuffer.clear();
    configuration.peerCertificate.clear();
    configuration.peerCertificateChain.clear();

    if (backend.get()) {
        Q_ASSERT(q_ptr);
        backend->init(static_cast<QSslSocket *>(q_ptr), this);
    }
}